

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int defragmentPage(MemPage *pPage,int nMaxFrag)

{
  u8 *puVar1;
  ushort uVar2;
  ushort uVar3;
  u16 uVar4;
  ushort uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ushort *puVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  u8 *local_70;
  u8 *local_60;
  
  puVar1 = pPage->aData;
  uVar12 = (ulong)pPage->hdrOffset;
  uVar11 = pPage->cellOffset;
  uVar5 = pPage->nCell;
  uVar13 = (uint)uVar11 + (uint)uVar5 * 2;
  uVar16 = pPage->pBt->usableSize;
  if ((nMaxFrag < (int)(uint)puVar1[uVar12 + 7]) ||
     (uVar2 = *(ushort *)(puVar1 + uVar12 + 1) << 8 | *(ushort *)(puVar1 + uVar12 + 1) >> 8,
     uVar2 == 0)) {
LAB_001331b5:
    local_60 = (u8 *)0x0;
    local_70 = puVar1;
    uVar9 = uVar16;
    for (uVar15 = 0; uVar5 != uVar15; uVar15 = uVar15 + 1) {
      uVar2 = *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar11) << 8 |
              *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar11) >> 8;
      if ((uVar2 < uVar13) ||
         (uVar7 = (uint)uVar2, uVar7 != uVar16 - 4 && (int)(uVar16 - 4) <= (int)(uint)uVar2)) {
        iVar8 = 0xfb96;
        goto LAB_001333b6;
      }
      uVar4 = (*pPage->xCellSize)(pPage,local_70 + uVar7);
      uVar14 = uVar9 - uVar4;
      if (((int)uVar14 < (int)uVar13) || ((int)uVar16 < (int)((uint)uVar4 + (uint)uVar2))) {
        iVar8 = 0xfb9c;
        goto LAB_001333b6;
      }
      *(ushort *)(puVar1 + uVar15 * 2 + (ulong)uVar11) = (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
      if (local_60 == (u8 *)0x0) {
        if (uVar14 != uVar7) {
          local_70 = (u8 *)pPage->pBt->pPager->pTmpSpace;
          uVar2 = *(ushort *)(puVar1 + uVar12 + 5) << 8 | *(ushort *)(puVar1 + uVar12 + 5) >> 8;
          memcpy(local_70 + uVar2,puVar1 + uVar2,(long)(int)(uVar9 - uVar2));
          local_60 = local_70;
          goto LAB_001332b1;
        }
        local_60 = (u8 *)0x0;
      }
      else {
LAB_001332b1:
        memcpy(puVar1 + uVar14,local_70 + uVar7,(ulong)uVar4);
      }
      uVar9 = uVar14;
    }
    puVar1[uVar12 + 7] = '\0';
    uVar16 = 0;
  }
  else {
    uVar3 = *(ushort *)(puVar1 + uVar2) << 8 | *(ushort *)(puVar1 + uVar2) >> 8;
    if ((uVar3 != 0) && ((puVar1[uVar3] != '\0' || (puVar1[(ulong)uVar3 + 1] != '\0'))))
    goto LAB_001331b5;
    uVar5 = *(ushort *)(puVar1 + uVar12 + 5) << 8 | *(ushort *)(puVar1 + uVar12 + 5) >> 8;
    iVar8 = (uint)uVar2 - (uint)uVar5;
    if ((uint)uVar2 < (uint)uVar5 || iVar8 == 0) {
      iVar8 = 0xfb74;
      goto LAB_001333b6;
    }
    uVar6 = *(ushort *)(puVar1 + (ulong)uVar2 + 2) << 8 |
            *(ushort *)(puVar1 + (ulong)uVar2 + 2) >> 8;
    uVar7 = (uint)uVar6;
    uVar16 = (uint)uVar3;
    if (uVar16 == 0) {
      local_70._0_4_ = 0;
    }
    else {
      uVar3 = *(ushort *)(puVar1 + (ulong)uVar3 + 2) << 8 |
              *(ushort *)(puVar1 + (ulong)uVar3 + 2) >> 8;
      local_70._0_4_ = (uint)uVar3;
      uVar7 = (uint)uVar2 + (uint)uVar6;
      memmove(puVar1 + (uVar7 + uVar3),puVar1 + uVar7,(long)(int)(uVar16 - uVar7));
      uVar7 = (uint)uVar6 + (uint)uVar3;
    }
    uVar9 = uVar5 + uVar7;
    memmove(puVar1 + uVar9,puVar1 + uVar5,(long)iVar8);
    for (puVar10 = (ushort *)(puVar1 + uVar11); puVar10 < puVar1 + uVar13; puVar10 = puVar10 + 1) {
      uVar11 = *puVar10 << 8 | *puVar10 >> 8;
      uVar14 = uVar7;
      if (((uint)uVar11 < (uint)uVar2) || (uVar14 = (uint)local_70, uVar11 < uVar16)) {
        uVar11 = uVar11 + (short)uVar14;
        *puVar10 = uVar11 * 0x100 | uVar11 >> 8;
      }
    }
    uVar16 = (uint)puVar1[uVar12 + 7];
  }
  if (uVar16 + (uVar9 - uVar13) == (uint)pPage->nFree) {
    *(ushort *)(puVar1 + uVar12 + 5) = (ushort)uVar9 << 8 | (ushort)uVar9 >> 8;
    (puVar1 + uVar12 + 1)[0] = '\0';
    (puVar1 + uVar12 + 1)[1] = '\0';
    memset(puVar1 + uVar13,0,(long)(int)(uVar9 - uVar13));
    return 0;
  }
  iVar8 = 0xfbb0;
LAB_001333b6:
  iVar8 = sqlite3CorruptError(iVar8);
  return iVar8;
}

Assistant:

static int defragmentPage(MemPage *pPage, int nMaxFrag){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */

  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  iCellFirst = cellOffset + 2*nCell;
  usableSize = pPage->pBt->usableSize;

  /* This block handles pages with two or fewer free blocks and nMaxFrag
  ** or fewer fragmented bytes. In this case it is faster to move the
  ** two (or one) blocks of cells using memmove() and add the required
  ** offsets to each pointer in the cell-pointer array than it is to 
  ** reconstruct the entire page.  */
  if( (int)data[hdr+7]<=nMaxFrag ){
    int iFree = get2byte(&data[hdr+1]);
    if( iFree ){
      int iFree2 = get2byte(&data[iFree]);

      /* pageFindSlot() has already verified that free blocks are sorted
      ** in order of offset within the page, and that no block extends
      ** past the end of the page. Provided the two free slots do not 
      ** overlap, this guarantees that the memmove() calls below will not
      ** overwrite the usableSize byte buffer, even if the database page
      ** is corrupt.  */
      assert( iFree2==0 || iFree2>iFree );
      assert( iFree+get2byte(&data[iFree+2]) <= usableSize );
      assert( iFree2==0 || iFree2+get2byte(&data[iFree2+2]) <= usableSize );

      if( 0==iFree2 || (data[iFree2]==0 && data[iFree2+1]==0) ){
        u8 *pEnd = &data[cellOffset + nCell*2];
        u8 *pAddr;
        int sz2 = 0;
        int sz = get2byte(&data[iFree+2]);
        int top = get2byte(&data[hdr+5]);
        if( top>=iFree ){
          return SQLITE_CORRUPT_PAGE(pPage);
        }
        if( iFree2 ){
          assert( iFree+sz<=iFree2 ); /* Verified by pageFindSlot() */
          sz2 = get2byte(&data[iFree2+2]);
          assert( iFree+sz+sz2+iFree2-(iFree+sz) <= usableSize );
          memmove(&data[iFree+sz+sz2], &data[iFree+sz], iFree2-(iFree+sz));
          sz += sz2;
        }
        cbrk = top+sz;
        assert( cbrk+(iFree-top) <= usableSize );
        memmove(&data[cbrk], &data[top], iFree-top);
        for(pAddr=&data[cellOffset]; pAddr<pEnd; pAddr+=2){
          pc = get2byte(pAddr);
          if( pc<iFree ){ put2byte(pAddr, pc+sz); }
          else if( pc<iFree2 ){ put2byte(pAddr, pc+sz2); }
        }
        goto defragment_out;
      }
    }
  }

  cbrk = usableSize;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
    /* These conditions have already been verified in btreeInitPage()
    ** if PRAGMA cell_size_check=ON.
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = pPage->xCellSize(pPage, &src[pc]);
    cbrk -= size;
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  data[hdr+7] = 0;

 defragment_out:
  if( data[hdr+7]+cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  return SQLITE_OK;
}